

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

void __thiscall QGles2CommandBuffer::~QGles2CommandBuffer(QGles2CommandBuffer *this)

{
  ~QGles2CommandBuffer(this);
  operator_delete(this,0x580);
  return;
}

Assistant:

QGles2CommandBuffer::~QGles2CommandBuffer()
{
    destroy();
}